

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall
ON_Brep::SetEdgeCurve(ON_Brep *this,ON_BrepEdge *edge,int c3_index,ON_Interval *sub_domain)

{
  bool bVar1;
  int iVar2;
  ON_Curve **ppOVar3;
  ON_Interval *local_78;
  undefined1 local_40 [8];
  ON_Interval curve_domain;
  bool rc;
  ON_Interval *sub_domain_local;
  int c3_index_local;
  ON_BrepEdge *edge_local;
  ON_Brep *this_local;
  
  curve_domain.m_t[1]._7_1_ = 0;
  if ((c3_index == -1) && (sub_domain == (ON_Interval *)0x0)) {
    edge->m_c3i = -1;
    ON_CurveProxy::SetProxyCurve(&edge->super_ON_CurveProxy,(ON_Curve *)0x0);
    curve_domain.m_t[1]._7_1_ = 1;
  }
  else if (((-1 < c3_index) &&
           (iVar2 = ON_SimpleArray<ON_Curve_*>::Count
                              (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>), c3_index <= iVar2))
          && (ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                                  (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,c3_index),
             *ppOVar3 != (ON_Curve *)0x0)) {
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,c3_index);
    (*((*ppOVar3)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
    if ((sub_domain == (ON_Interval *)0x0) ||
       ((bVar1 = ON_Interval::IsIncreasing(sub_domain), bVar1 &&
        (bVar1 = ON_Interval::Includes((ON_Interval *)local_40,sub_domain,false), bVar1)))) {
      edge->m_c3i = c3_index;
      ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,c3_index);
      local_78 = sub_domain;
      if (sub_domain == (ON_Interval *)0x0) {
        local_78 = (ON_Interval *)local_40;
      }
      ON_CurveProxy::SetProxyCurve(&edge->super_ON_CurveProxy,*ppOVar3,(ON_Interval)*&local_78->m_t)
      ;
      curve_domain.m_t[1]._7_1_ = 1;
    }
  }
  return (bool)(curve_domain.m_t[1]._7_1_ & 1);
}

Assistant:

bool ON_Brep::SetEdgeCurve( 
  ON_BrepEdge& edge,
  int c3_index,
  const ON_Interval* sub_domain
  )
{
  bool rc = false;
  if ( c3_index == - 1 && !sub_domain )
  {
    edge.m_c3i = -1;
    edge.SetProxyCurve(0);
    rc = true;
  }
  else if ( c3_index >= 0 && c3_index <= m_C3.Count() && m_C3[c3_index] )
  {
    ON_Interval curve_domain = m_C3[c3_index]->Domain();
    if ( !sub_domain || (sub_domain->IsIncreasing() && curve_domain.Includes(*sub_domain)) )
    {
      edge.m_c3i = c3_index;
      edge.SetProxyCurve( m_C3[c3_index], 
                          (sub_domain) ? *sub_domain : curve_domain
                          );
      rc = true;
    }
  }
  return rc;
}